

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall
ImGuiInputTextCallbackData::InsertChars
          (ImGuiInputTextCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  uint uVar1;
  char *__src;
  ImGuiContext *pIVar2;
  size_t sVar3;
  char *__dest;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = this->Flags;
  if (new_text_end == (char *)0x0) {
    sVar3 = strlen(new_text);
    iVar7 = (int)sVar3;
  }
  else {
    iVar7 = (int)new_text_end - (int)new_text;
  }
  pIVar2 = GImGui;
  iVar6 = this->BufTextLen;
  if (this->BufSize <= iVar6 + iVar7) {
    if ((uVar1 >> 0x12 & 1) == 0) {
      return;
    }
    iVar4 = 0x100;
    if (0x100 < iVar7) {
      iVar4 = iVar7;
    }
    if (iVar7 * 4 < iVar4) {
      iVar4 = iVar7 * 4;
    }
    iVar5 = 0x20;
    if (7 < iVar7) {
      iVar5 = iVar4;
    }
    iVar4 = iVar5 + iVar6 + 1;
    iVar6 = iVar5 + iVar6 + 2;
    if ((GImGui->InputTextState).TempBuffer.Capacity < iVar6) {
      __dest = (char *)ImGui::MemAlloc((long)iVar6);
      __src = (pIVar2->InputTextState).TempBuffer.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest,__src,(long)(pIVar2->InputTextState).TempBuffer.Size);
        ImGui::MemFree((pIVar2->InputTextState).TempBuffer.Data);
      }
      (pIVar2->InputTextState).TempBuffer.Data = __dest;
      (pIVar2->InputTextState).TempBuffer.Capacity = iVar6;
    }
    this->Buf = (pIVar2->InputTextState).TempBuffer.Data;
    (pIVar2->InputTextState).BufCapacityA = iVar4;
    this->BufSize = iVar4;
  }
  iVar6 = this->BufTextLen - pos;
  if (iVar6 != 0) {
    memmove(this->Buf + pos + iVar7,this->Buf + pos,(long)iVar6);
  }
  memcpy(this->Buf + pos,new_text,(long)iVar7);
  this->Buf[(long)iVar7 + (long)this->BufTextLen] = '\0';
  if (pos <= this->CursorPos) {
    this->CursorPos = this->CursorPos + iVar7;
  }
  this->SelectionEnd = this->CursorPos;
  this->SelectionStart = this->CursorPos;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen + iVar7;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const bool is_resizable = (Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen >= BufSize)
    {
        if (!is_resizable)
            return;

        // Contrary to STB_TEXTEDIT_INSERTCHARS() this is working in the UTF8 buffer, hence the midly similar code (until we remove the U16 buffer alltogether!)
        ImGuiContext& g = *GImGui;
        ImGuiInputTextState* edit_state = &g.InputTextState;
        IM_ASSERT(edit_state->ID != 0 && g.ActiveId == edit_state->ID);
        IM_ASSERT(Buf == edit_state->TempBuffer.Data);
        int new_buf_size = BufTextLen + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1;
        edit_state->TempBuffer.reserve(new_buf_size + 1);
        Buf = edit_state->TempBuffer.Data;
        BufSize = edit_state->BufCapacityA = new_buf_size;
    }

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}